

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.cpp
# Opt level: O3

void __thiscall
btConeTwistConstraint::calcAngleInfo2
          (btConeTwistConstraint *this,btTransform *transA,btTransform *transB,
          btMatrix3x3 *invInertiaWorldA,btMatrix3x3 *invInertiaWorldB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  btScalar bVar12;
  btScalar bVar13;
  btScalar bVar14;
  btScalar bVar15;
  btScalar bVar16;
  btScalar bVar17;
  btScalar bVar18;
  btScalar bVar19;
  btScalar bVar20;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar21;
  int iVar22;
  btConeTwistConstraint *this_00;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  btQuaternion q;
  btScalar swingLimit;
  btScalar swingAngle;
  btQuaternion q_1;
  float fStack_224;
  btVector3 local_1e8;
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  btScalar local_140;
  float local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  btMatrix3x3 local_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  btMatrix3x3 local_78;
  undefined1 local_48 [16];
  
  uStack_1d0 = local_1d8;
  uStack_1c0 = local_1c8;
  this->m_twistLimitSign = 0.0;
  this->m_swingCorrection = 0.0;
  this->m_solveTwistLimit = false;
  this->m_solveSwingLimit = false;
  if ((this->m_bMotorEnabled == true) && (this->m_useSolveConstraintObsolete == false)) {
    btMatrix3x3::setRotation(&local_b8,&this->m_qTarget);
    local_88 = 0;
    uStack_80 = 0;
    fVar23 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[0];
    fVar31 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
    fVar32 = (transA->m_basis).m_el[0].m_floats[0];
    fVar35 = (transA->m_basis).m_el[0].m_floats[1];
    fVar34 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
    fVar36 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[2];
    fVar37 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[2];
    fVar38 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[2];
    fVar39 = (transA->m_basis).m_el[2].m_floats[0];
    fVar40 = (transA->m_basis).m_el[2].m_floats[1];
    fVar42 = (transA->m_basis).m_el[2].m_floats[2];
    fVar62 = fVar34 * fVar42 + fVar23 * fVar39 + fVar31 * fVar40;
    fVar63 = fVar38 * fVar42 + fVar36 * fVar39 + fVar37 * fVar40;
    _local_1d8 = ZEXT416((uint)fVar63);
    fVar43 = (this->m_rbAFrame).m_origin.m_floats[1];
    fVar44 = (this->m_rbAFrame).m_origin.m_floats[0];
    fVar45 = (transA->m_basis).m_el[0].m_floats[2];
    fVar48 = (this->m_rbAFrame).m_origin.m_floats[2];
    fVar50 = (transA->m_basis).m_el[1].m_floats[1];
    fVar52 = (transA->m_basis).m_el[1].m_floats[0];
    fVar53 = (transA->m_basis).m_el[1].m_floats[2];
    fVar54 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
    fVar30 = (transB->m_basis).m_el[2].m_floats[1];
    fVar51 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
    fVar59 = (transB->m_basis).m_el[2].m_floats[0];
    fVar60 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
    fVar3 = (transB->m_basis).m_el[2].m_floats[2];
    fVar46 = fVar60 * fVar3 + fVar51 * fVar59 + fVar54 * fVar30;
    fVar61 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[1];
    fVar1 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[1];
    _local_1b8 = ZEXT416((uint)fVar1);
    fVar2 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[1];
    fVar47 = fVar2 * fVar3 + fVar1 * fVar59 + fVar61 * fVar30;
    fVar29 = (this->m_rbBFrame).m_origin.m_floats[1];
    local_108 = ZEXT416((uint)fVar29);
    fVar33 = (this->m_rbBFrame).m_origin.m_floats[0];
    local_f8 = ZEXT416((uint)fVar33);
    fVar41 = (this->m_rbBFrame).m_origin.m_floats[2];
    local_e8 = ZEXT416((uint)fVar41);
    local_d8 = ZEXT416((uint)local_b8.m_el[1].m_floats[0]);
    local_c8 = ZEXT416((uint)local_b8.m_el[0].m_floats[0]);
    fVar24 = fVar34 * fVar45 + fVar23 * fVar32 + fVar31 * fVar35;
    fVar26 = fVar34 * fVar53 + fVar23 * fVar52 + fVar31 * fVar50;
    fVar56 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[1];
    fVar23 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[2];
    local_118 = ZEXT416((uint)fVar23);
    fVar57 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[1];
    fVar31 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[2];
    local_128 = ZEXT416((uint)fVar31);
    fVar58 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[1];
    fVar34 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[2];
    local_138 = ZEXT416((uint)fVar34);
    fVar25 = fVar58 * fVar45 + fVar57 * fVar32 + fVar56 * fVar35;
    fVar27 = fVar58 * fVar53 + fVar57 * fVar52 + fVar56 * fVar50;
    fVar49 = fVar48 * fVar53 + fVar44 * fVar52 + fVar50 * fVar43 + (transA->m_origin).m_floats[1];
    fVar28 = fVar48 * fVar42 + fVar44 * fVar39 + fVar43 * fVar40 + (transA->m_origin).m_floats[2];
    local_1c8._0_4_ = fVar38 * fVar45 + fVar36 * fVar32 + fVar37 * fVar35;
    local_1c8._4_4_ = fVar38 * fVar53 + fVar36 * fVar52 + fVar37 * fVar50;
    fVar32 = -(fVar48 * fVar45 + fVar44 * fVar32 + fVar35 * fVar43 + (transA->m_origin).m_floats[0])
    ;
    fVar55 = (fVar24 * fVar32 - fVar26 * fVar49) - fVar62 * fVar28;
    fVar40 = fVar42 * fVar58 + fVar39 * fVar57 + fVar40 * fVar56;
    fVar44 = fVar3 * fVar34 + fVar59 * fVar31 + fVar30 * fVar23;
    local_198 = ZEXT416((uint)local_b8.m_el[2].m_floats[0]);
    fVar42 = local_b8.m_el[2].m_floats[0] * fVar44 +
             local_b8.m_el[0].m_floats[0] * fVar46 + fVar47 * local_b8.m_el[1].m_floats[0];
    local_1a8 = ZEXT416((uint)local_b8.m_el[2].m_floats[2]);
    fVar43 = local_b8.m_el[2].m_floats[2] * fVar44 +
             local_b8.m_el[0].m_floats[2] * fVar46 + fVar47 * local_b8.m_el[1].m_floats[2];
    local_188 = ZEXT416(0);
    uStack_1c0._0_4_ = fVar38 * 0.0 + fVar36 * 0.0 + fVar37 * 0.0;
    uStack_1c0._4_4_ = fVar38 * 0.0 + fVar36 * 0.0 + fVar37 * 0.0;
    fVar57 = -fVar28 * fVar40 + fVar32 * fVar25 + -fVar49 * fVar27;
    fStack_174 = local_b8.m_el[2].m_floats[1] * fVar44 +
                 fVar46 * local_b8.m_el[0].m_floats[1] + local_b8.m_el[1].m_floats[1] * fVar47;
    local_178 = fStack_174;
    fStack_170 = fStack_174;
    fStack_16c = fStack_174;
    local_168 = ZEXT416((uint)fVar42);
    local_78.m_el[2].m_floats[2] = fVar63 * fVar43 + fVar62 * fVar42 + fVar40 * fStack_174;
    local_158 = ZEXT416((uint)local_78.m_el[2].m_floats[2]);
    fVar56 = (fVar32 * (float)local_1c8 - local_1c8._4_4_ * fVar49) - fVar28 * fVar63;
    fVar37 = (transB->m_basis).m_el[0].m_floats[1];
    fVar32 = (transB->m_basis).m_el[1].m_floats[1];
    fVar38 = (transB->m_basis).m_el[0].m_floats[0];
    fVar35 = (transB->m_basis).m_el[1].m_floats[0];
    fVar39 = (transB->m_basis).m_el[0].m_floats[2];
    fVar36 = (transB->m_basis).m_el[1].m_floats[2];
    fVar50 = fVar60 * fVar39 + fVar51 * fVar38 + fVar54 * fVar37;
    fVar52 = fVar60 * fVar36 + fVar51 * fVar35 + fVar54 * fVar32;
    fVar45 = fVar2 * fVar39 + fVar1 * fVar38 + fVar61 * fVar37;
    fVar48 = fVar2 * fVar36 + fVar1 * fVar35 + fVar61 * fVar32;
    fVar53 = fVar34 * fVar39 + fVar31 * fVar38 + fVar23 * fVar37;
    fVar34 = fVar34 * fVar36 + fVar31 * fVar35 + fVar23 * fVar32;
    uVar4 = *(undefined8 *)(transB->m_origin).m_floats;
    fVar23 = local_b8.m_el[2].m_floats[0] * fVar53 +
             local_b8.m_el[0].m_floats[0] * fVar50 + local_b8.m_el[1].m_floats[0] * fVar45;
    fVar31 = local_b8.m_el[2].m_floats[0] * fVar34 +
             local_b8.m_el[0].m_floats[0] * fVar52 + local_b8.m_el[1].m_floats[0] * fVar48;
    fVar54 = local_b8.m_el[2].m_floats[1] * fVar53 +
             local_b8.m_el[0].m_floats[1] * fVar50 + local_b8.m_el[1].m_floats[1] * fVar45;
    fVar51 = local_b8.m_el[2].m_floats[1] * fVar34 +
             local_b8.m_el[0].m_floats[1] * fVar52 + local_b8.m_el[1].m_floats[1] * fVar48;
    fVar60 = local_b8.m_el[2].m_floats[2] * fVar53 +
             local_b8.m_el[0].m_floats[2] * fVar50 + local_b8.m_el[1].m_floats[2] * fVar45;
    fVar61 = local_b8.m_el[2].m_floats[2] * fVar34 +
             local_b8.m_el[0].m_floats[2] * fVar52 + local_b8.m_el[1].m_floats[2] * fVar48;
    local_78.m_el[0].m_floats[2] = fVar63 * fVar60 + fVar62 * fVar23 + fVar40 * fVar54;
    local_78.m_el[1].m_floats[2] = fVar63 * fVar61 + fVar62 * fVar31 + fVar40 * fVar51;
    local_78.m_el[0].m_floats[1] = fVar60 * local_1c8._4_4_ + fVar23 * fVar26 + fVar54 * fVar27;
    local_78.m_el[0].m_floats[0] = fVar60 * (float)local_1c8 + fVar23 * fVar24 + fVar54 * fVar25;
    local_78.m_el[0].m_floats[3] = 0.0;
    local_78.m_el[1].m_floats[1] = fVar61 * local_1c8._4_4_ + fVar31 * fVar26 + fVar51 * fVar27;
    local_78.m_el[1].m_floats[0] = fVar61 * (float)local_1c8 + fVar31 * fVar24 + fVar51 * fVar25;
    local_78.m_el[2].m_floats[0] = fVar43 * (float)local_1c8 + fVar42 * fVar24 + fStack_174 * fVar25
    ;
    local_78.m_el[2].m_floats[1] = fVar43 * local_1c8._4_4_ + fVar42 * fVar26 + fStack_174 * fVar27;
    local_78.m_el[1].m_floats[3] = 0.0;
    local_78.m_el[2].m_floats[3] = 0.0;
    local_48._4_4_ =
         fVar56 * fVar61 + fVar55 * fVar31 + fVar57 * fVar51 +
         fVar34 * 0.0 + fVar52 * 0.0 + fVar48 * 0.0 +
         (float)((ulong)uVar4 >> 0x20) + fVar41 * fVar36 + fVar33 * fVar35 + fVar29 * fVar32;
    local_48._0_4_ =
         fVar56 * fVar60 + fVar55 * fVar23 + fVar57 * fVar54 +
         fVar53 * 0.0 + fVar50 * 0.0 + fVar45 * 0.0 +
         (float)uVar4 + fVar41 * fVar39 + fVar33 * fVar38 + fVar29 * fVar37;
    local_48._8_4_ =
         fVar56 * fVar43 + fVar55 * fVar42 + fVar57 * fStack_174 +
         fVar44 * 0.0 + fVar46 * 0.0 + fVar47 * 0.0 +
         fVar41 * fVar3 + fVar33 * fVar59 + fVar30 * fVar29 + (transB->m_origin).m_floats[2];
    local_48._12_4_ = 0;
    btMatrix3x3::getRotation(&local_78,(btQuaternion *)&local_1e8);
    fVar31 = local_1e8.m_floats[0];
    fVar32 = local_1e8.m_floats[1];
    fVar23 = local_1e8.m_floats[2] * local_1e8.m_floats[2] + fVar31 * fVar31 + fVar32 * fVar32;
    if (1.1920929e-07 <= ABS(fVar23)) {
      (this->m_swingAxis).m_floats[3] = 0.0;
      fVar23 = 1.0 / SQRT(fVar23);
      *(ulong *)(this->m_swingAxis).m_floats = CONCAT44(fVar32 * fVar23,fVar31 * fVar23);
      (this->m_swingAxis).m_floats[2] = local_1e8.m_floats[2] * fVar23;
      fVar23 = -1.0;
      if (-1.0 <= local_1e8.m_floats[3]) {
        fVar23 = local_1e8.m_floats[3];
      }
      fVar31 = 1.0;
      if (fVar23 <= 1.0) {
        fVar31 = fVar23;
      }
      fVar23 = acosf(fVar31);
      this->m_swingCorrection = fVar23 + fVar23;
      if (1.1920929e-07 <= ABS(fVar23 + fVar23)) {
        this->m_solveSwingLimit = true;
      }
    }
  }
  else {
    btMatrix3x3::getRotation(&transA->m_basis,(btQuaternion *)&local_b8);
    bVar18 = local_b8.m_el[0].m_floats[3];
    bVar16 = local_b8.m_el[0].m_floats[2];
    bVar14 = local_b8.m_el[0].m_floats[1];
    bVar12 = local_b8.m_el[0].m_floats[0];
    btMatrix3x3::getRotation(&(this->m_rbAFrame).m_basis,(btQuaternion *)&local_b8);
    bVar19 = local_b8.m_el[0].m_floats[3];
    bVar17 = local_b8.m_el[0].m_floats[2];
    bVar15 = local_b8.m_el[0].m_floats[1];
    bVar13 = local_b8.m_el[0].m_floats[0];
    fStack_224 = -bVar14;
    auVar11._4_8_ = uStack_1c0;
    auVar11._0_4_ =
         (bVar12 * local_b8.m_el[0].m_floats[1] +
         bVar18 * local_b8.m_el[0].m_floats[2] + bVar16 * local_b8.m_el[0].m_floats[3]) -
         local_b8.m_el[0].m_floats[0] * bVar14;
    local_1c8 = auVar11._0_8_ << 0x20;
    uStack_1c0._0_4_ =
         (bVar18 * 0.0 + bVar18 * 0.0 + local_b8.m_el[0].m_floats[3] * 0.0) -
         local_b8.m_el[0].m_floats[3] * 0.0;
    uStack_1c0._4_4_ =
         (bVar14 * 0.0 + bVar18 * 0.0 + local_b8.m_el[0].m_floats[3] * 0.0) -
         local_b8.m_el[0].m_floats[1] * 0.0;
    local_1d8._4_4_ = bVar12 * local_b8.m_el[0].m_floats[3];
    local_1d8._0_4_ = local_b8.m_el[0].m_floats[0] * -bVar12;
    local_1c8._4_4_ = bVar14 * local_b8.m_el[0].m_floats[3];
    local_1c8._0_4_ = local_b8.m_el[0].m_floats[1] * -bVar14;
    btMatrix3x3::getRotation(&transB->m_basis,(btQuaternion *)&local_b8);
    bVar20 = local_b8.m_el[0].m_floats[3];
    bVar12 = local_b8.m_el[0].m_floats[2];
    local_1b8._4_4_ = local_b8.m_el[0].m_floats[1];
    local_1b8._0_4_ = local_b8.m_el[0].m_floats[0];
    _fStack_1b0 = 0;
    this_00 = (btConeTwistConstraint *)&this->m_rbBFrame;
    btMatrix3x3::getRotation((btMatrix3x3 *)this_00,(btQuaternion *)&local_b8);
    fVar43 = ((float)local_1b8._4_4_ * local_b8.m_el[0].m_floats[2] +
             bVar20 * local_b8.m_el[0].m_floats[0] +
             (float)local_1b8._0_4_ * local_b8.m_el[0].m_floats[3]) -
             bVar12 * local_b8.m_el[0].m_floats[1];
    fVar36 = (bVar12 * local_b8.m_el[0].m_floats[0] +
             local_b8.m_el[0].m_floats[1] * bVar20 +
             (float)local_1b8._4_4_ * local_b8.m_el[0].m_floats[3]) -
             local_b8.m_el[0].m_floats[2] * (float)local_1b8._0_4_;
    fVar38 = ((float)local_1b8._0_4_ * local_b8.m_el[0].m_floats[1] +
             local_b8.m_el[0].m_floats[2] * bVar20 + bVar12 * local_b8.m_el[0].m_floats[3]) -
             local_b8.m_el[0].m_floats[0] * (float)local_1b8._4_4_;
    fVar34 = (-(float)local_1b8._4_4_ * local_b8.m_el[0].m_floats[1] +
             local_b8.m_el[0].m_floats[3] * bVar20 +
             local_b8.m_el[0].m_floats[0] * -(float)local_1b8._0_4_) -
             bVar12 * local_b8.m_el[0].m_floats[2];
    fVar32 = -fVar36;
    local_1b8._0_4_ = fVar43;
    fStack_1b0 = fVar38;
    fStack_1ac = ((float)local_1b8._4_4_ * 0.0 +
                 bVar20 * 0.0 + fStack_1ac * local_b8.m_el[0].m_floats[3]) -
                 local_b8.m_el[0].m_floats[1] * fStack_1ac;
    fVar40 = -fVar38;
    fVar42 = -fVar43;
    fVar44 = (fStack_224 * bVar15 + bVar19 * bVar18 + (float)local_1d8._0_4_) - bVar17 * bVar16;
    fVar45 = (bVar14 * bVar17 + bVar13 * bVar18 + (float)local_1d8._4_4_) - bVar15 * bVar16;
    local_1d8._4_4_ = fVar34;
    local_1d8._0_4_ = fVar34;
    uStack_1d0._0_4_ = fVar34;
    uStack_1d0._4_4_ = fVar34;
    fVar48 = local_1c8._4_4_ * fVar43 +
             fVar40 * fVar45 + (float)local_1c8 * fVar34 + fVar32 * fVar44;
    fVar50 = fVar36 * fVar45 +
             fVar42 * (float)local_1c8 + local_1c8._4_4_ * fVar34 + fVar40 * fVar44;
    fVar52 = (float)local_1c8 * fVar38 +
             local_1c8._4_4_ * fVar32 + fVar45 * fVar34 + fVar42 * fVar44;
    fVar53 = fVar38 * local_1c8._4_4_ +
             fVar36 * (float)local_1c8 + fVar44 * fVar34 + fVar43 * fVar45;
    fVar37 = fVar50 * -0.0 + fVar48 * 0.0 + fVar53;
    fVar39 = fVar52 * -0.0 + fVar53 * 0.0 + fVar50;
    fVar35 = -fVar50 * 0.0 + (fVar48 * -0.0 - fVar52);
    fVar31 = (fVar52 * 0.0 + fVar53 * 0.0) - fVar48;
    fVar54 = fVar50 * fVar37 + -fVar52 * fVar31 + (fVar39 * fVar53 - fVar35 * fVar48);
    fVar23 = fVar52 * fVar39 + -fVar48 * fVar37 + (fVar31 * fVar53 - fVar35 * fVar50);
    fVar31 = fVar48 * fVar31 + -fVar50 * fVar39 + (fVar37 * fVar53 - fVar35 * fVar52);
    fVar35 = 1.0 / SQRT(fVar23 * fVar23 + fVar31 * fVar31 + fVar54 * fVar54);
    fVar54 = fVar54 * fVar35;
    fVar23 = fVar35 * fVar23;
    fVar35 = fVar35 * fVar31;
    fVar31 = fVar23 * 0.0 + fVar54 * 0.0 + fVar35;
    uVar21 = extraout_EAX;
    if (-0.9999999 <= fVar31) {
      fVar31 = fVar31 + 1.0;
      fVar31 = fVar31 + fVar31;
      if (fVar31 < 0.0) {
        fVar31 = sqrtf(fVar31);
        uVar21 = extraout_EAX_00;
      }
      else {
        fVar31 = SQRT(fVar31);
      }
      local_b8.m_el[0].m_floats[2] = 1.0 / fVar31;
      local_b8.m_el[0].m_floats[0] = local_b8.m_el[0].m_floats[2] * (fVar23 * 0.0 + fVar54 * -0.0);
      local_b8.m_el[0].m_floats[1] = local_b8.m_el[0].m_floats[2] * (fVar35 * 0.0 + -fVar23);
      local_b8.m_el[0].m_floats[2] = local_b8.m_el[0].m_floats[2] * (fVar35 * -0.0 + fVar54);
      fVar31 = fVar31 * 0.5;
    }
    else {
      local_b8.m_el[0].m_floats[2] = 0.0;
      fVar31 = 0.0;
      local_b8.m_el[0].m_floats[0] = -0.0;
      local_b8.m_el[0].m_floats[1] = 1.0;
    }
    local_b8.m_el[0].m_floats[3] =
         1.0 / SQRT(fVar31 * fVar31 +
                    local_b8.m_el[0].m_floats[2] * local_b8.m_el[0].m_floats[2] +
                    local_b8.m_el[0].m_floats[0] * local_b8.m_el[0].m_floats[0] +
                    local_b8.m_el[0].m_floats[1] * local_b8.m_el[0].m_floats[1]);
    local_b8.m_el[0].m_floats[0] = local_b8.m_el[0].m_floats[3] * local_b8.m_el[0].m_floats[0];
    local_b8.m_el[0].m_floats[1] = local_b8.m_el[0].m_floats[3] * local_b8.m_el[0].m_floats[1];
    local_b8.m_el[0].m_floats[2] = local_b8.m_el[0].m_floats[3] * local_b8.m_el[0].m_floats[2];
    local_b8.m_el[0].m_floats[3] = local_b8.m_el[0].m_floats[3] * fVar31;
    fVar31 = fVar50 * local_b8.m_el[0].m_floats[0] +
             fVar52 * -local_b8.m_el[0].m_floats[2] +
             local_b8.m_el[0].m_floats[3] * fVar48 + -local_b8.m_el[0].m_floats[1] * fVar53;
    local_78.m_el[0].m_floats[2] =
         fVar52 * local_b8.m_el[0].m_floats[1] +
         fVar48 * -local_b8.m_el[0].m_floats[0] +
         local_b8.m_el[0].m_floats[3] * fVar50 + -local_b8.m_el[0].m_floats[2] * fVar53;
    fVar35 = fVar48 * local_b8.m_el[0].m_floats[2] +
             fVar50 * -local_b8.m_el[0].m_floats[1] +
             local_b8.m_el[0].m_floats[3] * fVar52 + -local_b8.m_el[0].m_floats[0] * fVar53;
    local_78.m_el[0].m_floats[3] =
         fVar50 * local_b8.m_el[0].m_floats[2] +
         fVar48 * local_b8.m_el[0].m_floats[1] +
         local_b8.m_el[0].m_floats[3] * fVar53 + local_b8.m_el[0].m_floats[0] * fVar52;
    fVar23 = 1.0 / SQRT(local_78.m_el[0].m_floats[3] * local_78.m_el[0].m_floats[3] +
                        local_78.m_el[0].m_floats[2] * local_78.m_el[0].m_floats[2] +
                        fVar35 * fVar35 + fVar31 * fVar31);
    local_78.m_el[0].m_floats[2] = local_78.m_el[0].m_floats[2] * fVar23;
    local_78.m_el[0].m_floats[3] = local_78.m_el[0].m_floats[3] * fVar23;
    local_78.m_el[0].m_floats[1] = fVar31 * fVar23;
    local_78.m_el[0].m_floats[0] = fVar35 * fVar23;
    fVar23 = this->m_swingSpan1;
    fVar31 = this->m_swingSpan2;
    fVar35 = this->m_fixThresh;
    if ((fVar23 < fVar35) || (fVar31 < fVar35)) {
      fVar37 = (this->m_rbAFrame).m_basis.m_el[0].m_floats[0];
      fVar39 = (this->m_rbAFrame).m_basis.m_el[1].m_floats[0];
      fVar48 = (this->m_rbAFrame).m_basis.m_el[2].m_floats[0];
      fVar50 = (transA->m_basis).m_el[1].m_floats[0];
      fVar52 = (transA->m_basis).m_el[1].m_floats[1];
      fVar53 = (transA->m_basis).m_el[1].m_floats[2];
      fVar33 = fVar53 * fVar48 + fVar50 * fVar37 + fVar39 * fVar52;
      fVar61 = (transA->m_basis).m_el[2].m_floats[0];
      fVar1 = (transA->m_basis).m_el[2].m_floats[1];
      fVar54 = (this->m_rbBFrame).m_basis.m_el[0].m_floats[0];
      fVar30 = (this->m_rbBFrame).m_basis.m_el[1].m_floats[0];
      fVar51 = (this->m_rbBFrame).m_basis.m_el[2].m_floats[0];
      fVar41 = (transB->m_basis).m_el[0].m_floats[2] * fVar51 +
               (transB->m_basis).m_el[0].m_floats[0] * fVar54 +
               (transB->m_basis).m_el[0].m_floats[1] * fVar30;
      fVar59 = (transA->m_basis).m_el[0].m_floats[0];
      fVar60 = (transA->m_basis).m_el[0].m_floats[1];
      fVar2 = (transA->m_basis).m_el[2].m_floats[2];
      fVar3 = (transA->m_basis).m_el[0].m_floats[2];
      fVar29 = fVar48 * fVar2 + fVar37 * fVar61 + fVar1 * fVar39;
      fVar48 = fVar48 * fVar3 + fVar37 * fVar59 + fVar60 * fVar39;
      fVar62 = fVar51 * (transB->m_basis).m_el[1].m_floats[2] +
               fVar54 * (transB->m_basis).m_el[1].m_floats[0] +
               (transB->m_basis).m_el[1].m_floats[1] * fVar30;
      fVar63 = fVar51 * (transB->m_basis).m_el[2].m_floats[2] +
               fVar54 * (transB->m_basis).m_el[2].m_floats[0] +
               (transB->m_basis).m_el[2].m_floats[1] * fVar30;
      uVar4 = *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[0].m_floats + 1);
      fVar37 = (float)uVar4;
      fVar39 = (float)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[1].m_floats + 1);
      fVar56 = (float)uVar4;
      fVar57 = (float)((ulong)uVar4 >> 0x20);
      uVar4 = *(undefined8 *)((this->m_rbAFrame).m_basis.m_el[2].m_floats + 1);
      fVar30 = (float)uVar4;
      fVar51 = (float)((ulong)uVar4 >> 0x20);
      fVar58 = fVar3 * fVar30 + fVar59 * fVar37 + fVar60 * fVar56;
      fVar59 = fVar3 * fVar51 + fVar59 * fVar39 + fVar60 * fVar57;
      fVar54 = fVar53 * fVar30 + fVar50 * fVar37 + fVar52 * fVar56;
      fVar50 = fVar53 * fVar51 + fVar50 * fVar39 + fVar52 * fVar57;
      fVar52 = fVar2 * fVar30 + fVar61 * fVar37 + fVar1 * fVar56;
      fVar53 = fVar2 * fVar51 + fVar61 * fVar39 + fVar1 * fVar57;
      fVar39 = fVar63 * fVar52 + fVar41 * fVar58 + fVar62 * fVar54;
      fVar37 = fVar63 * fVar53 + fVar41 * fVar59 + fVar62 * fVar50;
      if ((fVar35 <= fVar23) || (fVar35 <= fVar31)) {
        fVar30 = fVar63 * fVar29 + fVar48 * fVar41 + fVar33 * fVar62;
        if (fVar35 <= fVar23) {
          if (((1.1920929e-07 <= ABS(fVar30)) || (1.1920929e-07 <= ABS(fVar39))) &&
             (this->m_solveSwingLimit = true, fVar35 <= fVar23)) {
            fVar31 = atan2f(fVar39,fVar30);
            fVar23 = this->m_swingSpan1;
            if (fVar31 <= fVar23) {
              fVar37 = 0.0;
              if (fVar31 < -fVar23) {
                fVar30 = cosf(fVar23);
                fVar39 = sinf(this->m_swingSpan1);
                fVar37 = 0.0;
                fVar39 = -fVar39;
              }
            }
            else {
              fVar30 = cosf(fVar23);
              fVar39 = sinf(this->m_swingSpan1);
              fVar37 = 0.0;
            }
          }
        }
        else if (((1.1920929e-07 <= ABS(fVar30)) || (1.1920929e-07 <= ABS(fVar37))) &&
                (this->m_solveSwingLimit = true, fVar35 <= fVar31)) {
          fVar31 = atan2f(fVar37,fVar30);
          fVar23 = this->m_swingSpan2;
          if (fVar31 <= fVar23) {
            fVar39 = 0.0;
            if (fVar31 < -fVar23) {
              fVar30 = cosf(fVar23);
              fVar37 = sinf(this->m_swingSpan2);
              fVar39 = 0.0;
              fVar37 = -fVar37;
            }
          }
          else {
            fVar30 = cosf(fVar23);
            fVar37 = sinf(this->m_swingSpan2);
            fVar39 = 0.0;
          }
        }
        fVar50 = fVar50 * fVar37 + fVar33 * fVar30 + fVar54 * fVar39;
        fVar35 = fVar53 * fVar37 + fVar30 * fVar29 + fVar39 * fVar52;
        fVar37 = fVar59 * fVar37 + fVar30 * fVar48 + fVar39 * fVar58;
        fVar23 = 1.0 / SQRT(fVar35 * fVar35 + fVar37 * fVar37 + fVar50 * fVar50);
        fVar31 = fVar62 * fVar23 * fVar35 - fVar50 * fVar23 * fVar63;
        fVar35 = fVar63 * fVar23 * fVar37 - fVar23 * fVar35 * fVar41;
        fVar37 = fVar50 * fVar23 * fVar41 - fVar23 * fVar37 * fVar62;
        auVar7._8_4_ = -fVar37;
        auVar7._0_8_ = CONCAT44(fVar35,fVar31) ^ 0x8000000080000000;
        auVar7._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_swingAxis).m_floats = auVar7;
        fVar23 = SQRT(fVar37 * fVar37 + fVar31 * fVar31 + fVar35 * fVar35);
        this->m_swingCorrection = fVar23;
        if (1.1920929e-07 <= ABS(fVar23)) {
          fVar23 = 1.0 / fVar23;
          *(ulong *)(this->m_swingAxis).m_floats = CONCAT44(fVar23 * -fVar35,fVar23 * -fVar31);
          (this->m_swingAxis).m_floats[2] = fVar23 * -fVar37;
        }
      }
      else {
        auVar9._4_4_ = -(uint)(ABS(fVar39) < 1.1920929e-07);
        auVar9._0_4_ = -(uint)(ABS(fVar39) < 1.1920929e-07);
        auVar9._8_4_ = -(uint)(ABS(fVar37) < 1.1920929e-07);
        auVar9._12_4_ = -(uint)(ABS(fVar37) < 1.1920929e-07);
        iVar22 = movmskpd(uVar21,auVar9);
        if (iVar22 != 3) {
          this->m_solveSwingLimit = true;
          auVar10._8_4_ = -(fVar41 * fVar33 - fVar48 * fVar62);
          auVar10._0_8_ =
               CONCAT44(fVar63 * fVar48 - fVar29 * fVar41,fVar62 * fVar29 - fVar33 * fVar63) ^
               0x8000000080000000;
          auVar10._12_4_ = 0;
          *(undefined1 (*) [16])(this->m_swingAxis).m_floats = auVar10;
        }
      }
    }
    else {
      local_140 = 0.0;
      this_00 = this;
      computeConeLimitInfo(this,(btQuaternion *)&local_b8,&local_13c,&local_1e8,&local_140);
      fVar23 = this->m_limitSoftness;
      if (local_140 * fVar23 < local_13c) {
        this->m_solveSwingLimit = true;
        fVar31 = -local_140 * fVar23 + local_13c;
        this->m_swingLimitRatio =
             (btScalar)
             (~-(uint)(local_13c < local_140) & 0x3f800000 |
             (~-(uint)(fVar23 < 0.9999999) & 0x3f800000 |
             (uint)(fVar31 / (-local_140 * fVar23 + local_140)) & -(uint)(fVar23 < 0.9999999)) &
             -(uint)(local_13c < local_140));
        this->m_swingCorrection = fVar31;
        this_00 = this;
        adjustSwingAxisToUseEllipseNormal(this,&local_1e8);
        fVar35 = local_1e8.m_floats[0];
        fVar39 = local_1e8.m_floats[1];
        fVar23 = fVar43 * local_1e8.m_floats[2] + (fVar38 * -fVar35 - fVar34 * fVar39);
        fVar31 = fVar36 * fVar35 +
                 (-fVar39 * fVar43 - local_1e8.m_floats[2] * (float)local_1d8._0_4_);
        fVar37 = fVar38 * fVar39 +
                 (-local_1e8.m_floats[2] * fVar36 - fVar35 * (float)local_1d8._4_4_);
        fVar48 = fVar38 * local_1e8.m_floats[2] + fVar35 * fVar43 + fVar39 * fVar36;
        fVar35 = fVar31 * fVar36 +
                 fVar23 * fVar40 + fVar42 * fVar48 + fVar37 * (float)local_1d8._0_4_;
        fVar39 = fVar37 * fVar38 +
                 fVar31 * fVar42 + fVar32 * fVar48 + fVar23 * (float)local_1d8._4_4_;
        auVar6._4_4_ = fVar39;
        auVar6._0_4_ = fVar35;
        fVar23 = fVar23 * fVar43 + fVar37 * fVar32 + fVar48 * fVar40 + fVar34 * fVar31;
        auVar6._8_4_ = fVar23;
        auVar6._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_swingAxis).m_floats = auVar6;
        (this->m_twistAxisA).m_floats[0] = 0.0;
        (this->m_twistAxisA).m_floats[1] = 0.0;
        (this->m_twistAxisA).m_floats[2] = 0.0;
        (this->m_twistAxisA).m_floats[3] = 0.0;
        this->m_kSwing =
             1.0 / ((invInertiaWorldB->m_el[2].m_floats[2] * fVar23 +
                    invInertiaWorldB->m_el[0].m_floats[2] * fVar35 +
                    invInertiaWorldB->m_el[1].m_floats[2] * fVar39) * fVar23 +
                    (invInertiaWorldB->m_el[2].m_floats[0] * fVar23 +
                    invInertiaWorldB->m_el[0].m_floats[0] * fVar35 +
                    invInertiaWorldB->m_el[1].m_floats[0] * fVar39) * fVar35 +
                    (invInertiaWorldB->m_el[2].m_floats[1] * fVar23 +
                    invInertiaWorldB->m_el[0].m_floats[1] * fVar35 +
                    invInertiaWorldB->m_el[1].m_floats[1] * fVar39) * fVar39 +
                   (invInertiaWorldA->m_el[2].m_floats[2] * fVar23 +
                   invInertiaWorldA->m_el[0].m_floats[2] * fVar35 +
                   invInertiaWorldA->m_el[1].m_floats[2] * fVar39) * fVar23 +
                   (invInertiaWorldA->m_el[2].m_floats[0] * fVar23 +
                   invInertiaWorldA->m_el[0].m_floats[0] * fVar35 +
                   invInertiaWorldA->m_el[1].m_floats[0] * fVar39) * fVar35 +
                   (invInertiaWorldA->m_el[2].m_floats[1] * fVar23 +
                   invInertiaWorldA->m_el[0].m_floats[1] * fVar35 +
                   invInertiaWorldA->m_el[1].m_floats[1] * fVar39) * fVar39);
      }
    }
    if (0.0 <= this->m_twistSpan) {
      computeTwistLimitInfo(this_00,(btQuaternion *)&local_78,&this->m_twistAngle,&local_1e8);
      fVar23 = this->m_twistAngle;
      fVar31 = this->m_limitSoftness;
      fVar35 = this->m_twistSpan;
      fVar37 = local_1e8.m_floats[0];
      fVar39 = local_1e8.m_floats[1];
      if (fVar35 * fVar31 < fVar23) {
        this->m_solveTwistLimit = true;
        fVar48 = -fVar35 * fVar31 + fVar23;
        this->m_twistLimitRatio =
             (btScalar)
             (~-(uint)(fVar23 < fVar35) & 0x3f800000 |
             (~-(uint)(fVar31 < 0.9999999) & 0x3f800000 |
             (uint)(fVar48 / (-fVar35 * fVar31 + fVar35)) & -(uint)(fVar31 < 0.9999999)) &
             -(uint)(fVar23 < fVar35));
        this->m_twistCorrection = fVar48;
        fVar23 = fVar43 * local_1e8.m_floats[2] + (fVar38 * -fVar37 - fVar34 * fVar39);
        fVar35 = fVar36 * fVar37 +
                 (-fVar39 * (float)local_1b8._0_4_ - local_1e8.m_floats[2] * (float)local_1d8._0_4_)
        ;
        fVar48 = fVar38 * fVar39 +
                 (-local_1e8.m_floats[2] * fVar36 - fVar37 * (float)local_1d8._4_4_);
        fVar31 = fVar38 * local_1e8.m_floats[2] + fVar37 * fVar43 + fVar39 * fVar36;
        fVar36 = fVar36 * fVar35 +
                 fVar23 * fVar40 + fVar42 * fVar31 + fVar48 * (float)local_1d8._0_4_;
        fVar38 = fVar38 * fVar48 +
                 fVar35 * fVar42 + fVar32 * fVar31 + fVar23 * (float)local_1d8._4_4_;
        fVar23 = fVar23 * fVar43 + fVar48 * fVar32 + fVar31 * fVar40 + fVar35 * fVar34;
        auVar5._4_4_ = fVar38;
        auVar5._0_4_ = fVar36;
        auVar5._8_4_ = fVar23;
        auVar5._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_twistAxis).m_floats = auVar5;
        this->m_kTwist =
             1.0 / ((invInertiaWorldB->m_el[2].m_floats[2] * fVar23 +
                    invInertiaWorldB->m_el[0].m_floats[2] * fVar36 +
                    invInertiaWorldB->m_el[1].m_floats[2] * fVar38) * fVar23 +
                    (invInertiaWorldB->m_el[2].m_floats[0] * fVar23 +
                    invInertiaWorldB->m_el[0].m_floats[0] * fVar36 +
                    invInertiaWorldB->m_el[1].m_floats[0] * fVar38) * fVar36 +
                    (invInertiaWorldB->m_el[2].m_floats[1] * fVar23 +
                    invInertiaWorldB->m_el[0].m_floats[1] * fVar36 +
                    invInertiaWorldB->m_el[1].m_floats[1] * fVar38) * fVar38 +
                   (invInertiaWorldA->m_el[2].m_floats[2] * fVar23 +
                   invInertiaWorldA->m_el[0].m_floats[2] * fVar36 +
                   invInertiaWorldA->m_el[1].m_floats[2] * fVar38) * fVar23 +
                   (invInertiaWorldA->m_el[2].m_floats[0] * fVar23 +
                   invInertiaWorldA->m_el[0].m_floats[0] * fVar36 +
                   invInertiaWorldA->m_el[1].m_floats[0] * fVar38) * fVar36 +
                   (invInertiaWorldA->m_el[2].m_floats[1] * fVar23 +
                   invInertiaWorldA->m_el[0].m_floats[1] * fVar36 +
                   invInertiaWorldA->m_el[1].m_floats[1] * fVar38) * fVar38);
      }
      if (this->m_solveSwingLimit == true) {
        fVar31 = fVar45 * local_1e8.m_floats[2] + (local_1c8._4_4_ * -fVar37 - fVar44 * fVar39);
        fVar32 = (float)local_1c8 * fVar37 + (-fVar39 * fVar45 - local_1e8.m_floats[2] * fVar44);
        fVar35 = local_1c8._4_4_ * fVar39 +
                 (-local_1e8.m_floats[2] * (float)local_1c8 - fVar37 * fVar44);
        fVar23 = local_1c8._4_4_ * local_1e8.m_floats[2] +
                 fVar37 * fVar45 + fVar39 * (float)local_1c8;
        auVar8._4_4_ = fVar35 * local_1c8._4_4_ +
                       ((-(float)local_1c8 * fVar23 + fVar31 * fVar44) - fVar32 * fVar45);
        auVar8._0_4_ = fVar32 * (float)local_1c8 +
                       ((-fVar45 * fVar23 + fVar35 * fVar44) - fVar31 * local_1c8._4_4_);
        auVar8._8_4_ = fVar31 * fVar45 +
                       ((fVar23 * -local_1c8._4_4_ + fVar44 * fVar32) - fVar35 * (float)local_1c8);
        auVar8._12_4_ = 0;
        *(undefined1 (*) [16])(this->m_twistAxisA).m_floats = auVar8;
      }
    }
    else {
      this->m_twistAngle = 0.0;
    }
  }
  return;
}

Assistant:

void btConeTwistConstraint::calcAngleInfo2(const btTransform& transA, const btTransform& transB, const btMatrix3x3& invInertiaWorldA,const btMatrix3x3& invInertiaWorldB)
{
	m_swingCorrection = btScalar(0.);
	m_twistLimitSign = btScalar(0.);
	m_solveTwistLimit = false;
	m_solveSwingLimit = false;
	// compute rotation of A wrt B (in constraint space)
	if (m_bMotorEnabled && (!m_useSolveConstraintObsolete))
	{	// it is assumed that setMotorTarget() was alredy called 
		// and motor target m_qTarget is within constraint limits
		// TODO : split rotation to pure swing and pure twist
		// compute desired transforms in world
		btTransform trPose(m_qTarget);
		btTransform trA = transA * m_rbAFrame;
		btTransform trB = transB * m_rbBFrame;
		btTransform trDeltaAB = trB * trPose * trA.inverse();
		btQuaternion qDeltaAB = trDeltaAB.getRotation();
		btVector3 swingAxis = 	btVector3(qDeltaAB.x(), qDeltaAB.y(), qDeltaAB.z());
		float swingAxisLen2 = swingAxis.length2();
		if(btFuzzyZero(swingAxisLen2))
		{
		   return;
		}
		m_swingAxis = swingAxis;
		m_swingAxis.normalize();
		m_swingCorrection = qDeltaAB.getAngle();
		if(!btFuzzyZero(m_swingCorrection))
		{
			m_solveSwingLimit = true;
		}
		return;
	}


	{
		// compute rotation of A wrt B (in constraint space)
		btQuaternion qA = transA.getRotation() * m_rbAFrame.getRotation();
		btQuaternion qB = transB.getRotation() * m_rbBFrame.getRotation();
		btQuaternion qAB = qB.inverse() * qA;
		// split rotation into cone and twist
		// (all this is done from B's perspective. Maybe I should be averaging axes...)
		btVector3 vConeNoTwist = quatRotate(qAB, vTwist); vConeNoTwist.normalize();
		btQuaternion qABCone  = shortestArcQuat(vTwist, vConeNoTwist); qABCone.normalize();
		btQuaternion qABTwist = qABCone.inverse() * qAB; qABTwist.normalize();

		if (m_swingSpan1 >= m_fixThresh && m_swingSpan2 >= m_fixThresh)
		{
			btScalar swingAngle, swingLimit = 0; btVector3 swingAxis;
			computeConeLimitInfo(qABCone, swingAngle, swingAxis, swingLimit);

			if (swingAngle > swingLimit * m_limitSoftness)
			{
				m_solveSwingLimit = true;

				// compute limit ratio: 0->1, where
				// 0 == beginning of soft limit
				// 1 == hard/real limit
				m_swingLimitRatio = 1.f;
				if (swingAngle < swingLimit && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_swingLimitRatio = (swingAngle - swingLimit * m_limitSoftness)/
										(swingLimit - swingLimit * m_limitSoftness);
				}				

				// swing correction tries to get back to soft limit
				m_swingCorrection = swingAngle - (swingLimit * m_limitSoftness);

				// adjustment of swing axis (based on ellipse normal)
				adjustSwingAxisToUseEllipseNormal(swingAxis);

				// Calculate necessary axis & factors		
				m_swingAxis = quatRotate(qB, -swingAxis);

				m_twistAxisA.setValue(0,0,0);

				m_kSwing =  btScalar(1.) /
					(computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_swingAxis,invInertiaWorldB));
			}
		}
		else
		{
			// you haven't set any limits;
			// or you're trying to set at least one of the swing limits too small. (if so, do you really want a conetwist constraint?)
			// anyway, we have either hinge or fixed joint
			btVector3 ivA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
			btVector3 jvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
			btVector3 kvA = transA.getBasis() * m_rbAFrame.getBasis().getColumn(2);
			btVector3 ivB = transB.getBasis() * m_rbBFrame.getBasis().getColumn(0);
			btVector3 target;
			btScalar x = ivB.dot(ivA);
			btScalar y = ivB.dot(jvA);
			btScalar z = ivB.dot(kvA);
			if((m_swingSpan1 < m_fixThresh) && (m_swingSpan2 < m_fixThresh))
			{ // fixed. We'll need to add one more row to constraint
				if((!btFuzzyZero(y)) || (!(btFuzzyZero(z))))
				{
					m_solveSwingLimit = true;
					m_swingAxis = -ivB.cross(ivA);
				}
			}
			else
			{
				if(m_swingSpan1 < m_fixThresh)
				{ // hinge around Y axis
//					if(!(btFuzzyZero(y)))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(z))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan2 >= m_fixThresh)
						{
							y = btScalar(0.f);
							btScalar span2 = btAtan2(z, x);
							if(span2 > m_swingSpan2)
							{
								x = btCos(m_swingSpan2);
								z = btSin(m_swingSpan2);
							}
							else if(span2 < -m_swingSpan2)
							{
								x =  btCos(m_swingSpan2);
								z = -btSin(m_swingSpan2);
							}
						}
					}
				}
				else
				{ // hinge around Z axis
//					if(!btFuzzyZero(z))
					if((!(btFuzzyZero(x))) || (!(btFuzzyZero(y))))
					{
						m_solveSwingLimit = true;
						if(m_swingSpan1 >= m_fixThresh)
						{
							z = btScalar(0.f);
							btScalar span1 = btAtan2(y, x);
							if(span1 > m_swingSpan1)
							{
								x = btCos(m_swingSpan1);
								y = btSin(m_swingSpan1);
							}
							else if(span1 < -m_swingSpan1)
							{
								x =  btCos(m_swingSpan1);
								y = -btSin(m_swingSpan1);
							}
						}
					}
				}
				target[0] = x * ivA[0] + y * jvA[0] + z * kvA[0];
				target[1] = x * ivA[1] + y * jvA[1] + z * kvA[1];
				target[2] = x * ivA[2] + y * jvA[2] + z * kvA[2];
				target.normalize();
				m_swingAxis = -ivB.cross(target);
                                m_swingCorrection = m_swingAxis.length();

                                if (!btFuzzyZero(m_swingCorrection))
                                    m_swingAxis.normalize();
			}
		}

		if (m_twistSpan >= btScalar(0.f))
		{
			btVector3 twistAxis;
			computeTwistLimitInfo(qABTwist, m_twistAngle, twistAxis);

			if (m_twistAngle > m_twistSpan*m_limitSoftness)
			{
				m_solveTwistLimit = true;

				m_twistLimitRatio = 1.f;
				if (m_twistAngle < m_twistSpan && m_limitSoftness < 1.f - SIMD_EPSILON)
				{
					m_twistLimitRatio = (m_twistAngle - m_twistSpan * m_limitSoftness)/
										(m_twistSpan  - m_twistSpan * m_limitSoftness);
				}

				// twist correction tries to get back to soft limit
				m_twistCorrection = m_twistAngle - (m_twistSpan * m_limitSoftness);

				m_twistAxis = quatRotate(qB, -twistAxis);

				m_kTwist = btScalar(1.) /
					(computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldA) +
					 computeAngularImpulseDenominator(m_twistAxis,invInertiaWorldB));
			}

			if (m_solveSwingLimit)
				m_twistAxisA = quatRotate(qA, -twistAxis);
		}
		else
		{
			m_twistAngle = btScalar(0.f);
		}
	}
}